

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall
QDateTimeEditPrivate::QDateTimeEditPrivate(QDateTimeEditPrivate *this,QTimeZone *zone)

{
  QDateTime *this_00;
  QTimeZone *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  undefined8 *puVar1;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffff40;
  QVariant *other;
  QCalendar in_stack_ffffffffffffff48;
  QVariant *this_01;
  QDateTimeEditPrivate *this_02;
  QDate local_70;
  QDateTime local_68 [8];
  undefined1 local_60 [16];
  QCalendar local_50 [8];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractSpinBoxPrivate::QAbstractSpinBoxPrivate(in_stack_ffffffffffffff40);
  puVar1 = in_RDI + 0x7b;
  QCalendar::QCalendar(local_50);
  QDateTimeParser::QDateTimeParser
            ((QDateTimeParser *)in_stack_ffffffffffffff40,(Type)((ulong)puVar1 >> 0x20),
             (Context)puVar1,in_stack_ffffffffffffff48);
  *in_RDI = &PTR__QDateTimeEditPrivate_00d12348;
  in_RDI[0x7b] = &PTR__QDateTimeEditPrivate_00d12490;
  *(undefined4 *)(in_RDI + 0x8e) = 0;
  QFlags<QDateTimeEdit::Section>::QFlags((QFlags<QDateTimeEdit::Section> *)0x56065c);
  *(undefined1 *)((long)in_RDI + 0x474) = 0;
  QString::QString((QString *)0x560674);
  QString::QString((QString *)0x560685);
  QString::QString((QString *)0x560696);
  QString::QString((QString *)0x5606a7);
  ::QVariant::QVariant((QVariant *)0x5606b8);
  *(undefined1 *)(in_RDI + 0x9f) = 0;
  *(undefined1 *)((long)in_RDI + 0x4f9) = 0;
  *(undefined1 *)((long)in_RDI + 0x4fa) = 0;
  *(undefined4 *)((long)in_RDI + 0x4fc) = 0;
  in_RDI[0xa0] = 0;
  QTimeZone::QTimeZone((QTimeZone *)(in_RDI + 0xa1),in_RSI);
  *(undefined1 *)((long)in_RDI + 0x45c) = 1;
  *(undefined4 *)(in_RDI + 0x71) = 0x10;
  *(undefined4 *)(in_RDI + 0x7c) = 0xfffffffe;
  other = (QVariant *)local_60;
  QDate::QDate((QDate *)other,0x6d8,9,0xe);
  this_00 = (QDateTime *)(local_60 + 8);
  QDate::startOfDay((QTimeZone *)this_00);
  this_01 = (QVariant *)(local_48 + 0x20);
  ::QVariant::QVariant(this_01,this_00);
  ::QVariant::operator=(this_01,other);
  ::QVariant::~QVariant(this_01);
  QDateTime::~QDateTime(this_00);
  QDate::QDate(&local_70,9999,0xc,0x1f);
  QDate::endOfDay((QTimeZone *)local_68);
  this_02 = (QDateTimeEditPrivate *)local_48;
  ::QVariant::QVariant((QVariant *)this_02,local_68);
  ::QVariant::operator=(this_01,other);
  ::QVariant::~QVariant((QVariant *)this_02);
  QDateTime::~QDateTime(local_68);
  readLocaleSettings(this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeEditPrivate::QDateTimeEditPrivate(const QTimeZone &zone)
    : QDateTimeParser(QMetaType::QDateTime, QDateTimeParser::DateTimeEdit, QCalendar()),
      timeZone(zone)
{
    fixday = true;
    type = QMetaType::QDateTime;
    currentSectionIndex = FirstSectionIndex;

    minimum = QDATETIMEEDIT_COMPAT_DATE_MIN.startOfDay(timeZone);
    maximum = QDATETIMEEDIT_DATE_MAX.endOfDay(timeZone);
    readLocaleSettings();
}